

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundTableRef *ref)

{
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> _Var1;
  undefined8 uVar2;
  BoundBaseTableRef *ref_00;
  element_type *this_00;
  InternalException *this_01;
  BoundTableRef *in_RDX;
  pointer *__ptr;
  undefined1 local_78 [72];
  
  switch(in_RDX->type) {
  case BASE_TABLE:
    ref_00 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(in_RDX);
    CreatePlan((Binder *)ref,ref_00);
    break;
  case SUBQUERY:
    BoundTableRef::Cast<duckdb::BoundSubqueryRef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundSubqueryRef *)ref);
    break;
  case JOIN:
    BoundTableRef::Cast<duckdb::BoundJoinRef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundJoinRef *)ref);
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_78._0_8_ = (long)local_78 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Unsupported bound table ref type (%s)","");
    EnumUtil::ToString<duckdb::TableReferenceType>((string *)(local_78 + 0x28),in_RDX->type);
    InternalException::InternalException<std::__cxx11::string>
              (this_01,(string *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_78 + 0x28));
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case TABLE_FUNCTION:
    BoundTableRef::Cast<duckdb::BoundTableFunction>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundTableFunction *)ref);
    break;
  case EXPRESSION_LIST:
    BoundTableRef::Cast<duckdb::BoundExpressionListRef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundExpressionListRef *)ref);
    break;
  case CTE:
    BoundTableRef::Cast<duckdb::BoundCTERef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundCTERef *)ref);
    break;
  case EMPTY_FROM:
    BoundTableRef::Cast<duckdb::BoundEmptyTableRef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundEmptyTableRef *)ref);
    break;
  case PIVOT:
    BoundTableRef::Cast<duckdb::BoundPivotRef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundPivotRef *)ref);
    break;
  case COLUMN_DATA:
    BoundTableRef::Cast<duckdb::BoundColumnDataRef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundColumnDataRef *)ref);
    break;
  case DELIM_GET:
    BoundTableRef::Cast<duckdb::BoundDelimGetRef>(in_RDX);
    CreatePlan((Binder *)local_78,(BoundDelimGetRef *)ref);
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._0_8_;
  _Var1._M_head_impl =
       (in_RDX->sample).
       super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (SampleOptions *)0x0) {
    this_00 = (element_type *)operator_new(0x70);
    (in_RDX->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
    super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
    local_78._32_8_ = local_78._0_8_;
    local_78._0_8_ = _Var1._M_head_impl;
    LogicalSample::LogicalSample
              ((LogicalSample *)this_00,
               (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)local_78,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)(local_78 + 0x20));
    if ((SampleOptions *)local_78._32_8_ != (SampleOptions *)0x0) {
      (**(code **)(*(long *)local_78._32_8_ + 8))();
    }
    uVar2 = local_78._0_8_;
    local_78._32_8_ = 0;
    if ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
        local_78._0_8_ !=
        (__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0) {
      Value::~Value((Value *)local_78._0_8_);
      operator_delete((void *)uVar2);
    }
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundTableRef &ref) {
	unique_ptr<LogicalOperator> root;
	switch (ref.type) {
	case TableReferenceType::BASE_TABLE:
		root = CreatePlan(ref.Cast<BoundBaseTableRef>());
		break;
	case TableReferenceType::SUBQUERY:
		root = CreatePlan(ref.Cast<BoundSubqueryRef>());
		break;
	case TableReferenceType::JOIN:
		root = CreatePlan(ref.Cast<BoundJoinRef>());
		break;
	case TableReferenceType::TABLE_FUNCTION:
		root = CreatePlan(ref.Cast<BoundTableFunction>());
		break;
	case TableReferenceType::EMPTY_FROM:
		root = CreatePlan(ref.Cast<BoundEmptyTableRef>());
		break;
	case TableReferenceType::EXPRESSION_LIST:
		root = CreatePlan(ref.Cast<BoundExpressionListRef>());
		break;
	case TableReferenceType::COLUMN_DATA:
		root = CreatePlan(ref.Cast<BoundColumnDataRef>());
		break;
	case TableReferenceType::CTE:
		root = CreatePlan(ref.Cast<BoundCTERef>());
		break;
	case TableReferenceType::PIVOT:
		root = CreatePlan(ref.Cast<BoundPivotRef>());
		break;
	case TableReferenceType::DELIM_GET:
		root = CreatePlan(ref.Cast<BoundDelimGetRef>());
		break;
	case TableReferenceType::INVALID:
	default:
		throw InternalException("Unsupported bound table ref type (%s)", EnumUtil::ToString(ref.type));
	}
	// plan the sample clause
	if (ref.sample) {
		root = make_uniq<LogicalSample>(std::move(ref.sample), std::move(root));
	}
	return root;
}